

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_OutlineFigure::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_OutlineFigure *this)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  ON_OutlineFigurePoint *pOVar4;
  ON_OutlineFigurePoint *pOVar5;
  uint uVar6;
  ON_OutlineFigurePoint *local_170;
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  undefined8 local_120;
  double maxf;
  double minf;
  ON_BoundingBox bez_bbox;
  ON_3dPoint local_d0;
  uint local_b4;
  undefined1 local_b0 [4];
  ON__UINT32 j;
  ON_BezierCurve bez;
  ON__UINT32 degree_1;
  ON__UINT32 i_1;
  ON_OutlineFigurePoint cv [4];
  undefined1 auStack_50 [4];
  ON_OutlineFigurePoint p;
  ON__UINT32 degree;
  ON__UINT32 i;
  ON_2fPoint bbox_cv_max;
  ON_2fPoint bbox_cv_min;
  ON_2fPoint bbox_max;
  ON_2fPoint bbox_min;
  ON_OutlineFigurePoint *a;
  ON__UINT32 figure_end_dex;
  ON_OutlineFigure *this_local;
  
  if (this->m_bbox_status == '\0') {
    this->m_bbox_status = '\a';
    fVar3 = (float)Internal_FigureEndDex(this,false);
    if (fVar3 != 0.0) {
      pOVar4 = ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points);
      _degree = pOVar4->m_point;
      bbox_cv_max = _degree;
      bbox_cv_min = _degree;
      bbox_max = _degree;
      for (p.m_point.y = 0.0; (uint)p.m_point.y < (uint)fVar3;
          p.m_point.y = (float)((int)p.m_point.y + 1)) {
        p.m_point.x = (float)Internal_SegmentDegree(this,(ON__UINT32)p.m_point.y);
        if ((p.m_point.x != 0.0) && ((uint)p.m_point.x < 4)) {
          pOVar5 = pOVar4 + (uint)((int)p.m_point.y + (int)p.m_point.x);
          cv[3].m_point.y._0_1_ = pOVar5->m_point_type;
          cv[3].m_point.y._1_1_ = pOVar5->m_point_proximity;
          cv[3].m_point.y._2_2_ = pOVar5->m_figure_index;
          unique0x00012004 = (pOVar5->m_point).x;
          p._0_4_ = (pOVar5->m_point).y;
          Internal_GrowBBox((ON_2fPoint *)auStack_50,(ON_2fPoint *)auStack_50,&bbox_max,&bbox_cv_min
                           );
          if (1 < (uint)p.m_point.x) {
            p.m_point.y = (float)((int)p.m_point.y + 1);
            pOVar5 = pOVar4 + (uint)p.m_point.y;
            cv[3].m_point.y._0_1_ = pOVar5->m_point_type;
            cv[3].m_point.y._1_1_ = pOVar5->m_point_proximity;
            cv[3].m_point.y._2_2_ = pOVar5->m_figure_index;
            unique0x00012004 = (pOVar5->m_point).x;
            p._0_4_ = (pOVar5->m_point).y;
            Internal_GrowBBox((ON_2fPoint *)auStack_50,(ON_2fPoint *)auStack_50,&bbox_cv_max,
                              (ON_2fPoint *)&degree);
            if (p.m_point.x == 4.2039e-45) {
              p.m_point.y = (float)((int)p.m_point.y + 1);
              pOVar5 = pOVar4 + (uint)p.m_point.y;
              cv[3].m_point.y._0_1_ = pOVar5->m_point_type;
              cv[3].m_point.y._1_1_ = pOVar5->m_point_proximity;
              cv[3].m_point.y._2_2_ = pOVar5->m_figure_index;
              unique0x00012004 = (pOVar5->m_point).x;
              p._0_4_ = (pOVar5->m_point).y;
              Internal_GrowBBox((ON_2fPoint *)auStack_50,(ON_2fPoint *)auStack_50,&bbox_cv_max,
                                (ON_2fPoint *)&degree);
            }
          }
        }
      }
      if (bbox_max.x <= bbox_cv_max.x) {
        if ((float)degree <= bbox_cv_min.x) {
          if (bbox_max.y <= bbox_cv_max.y) {
            if ((float)i <= bbox_cv_min.y) {
              this->m_bbox_min = bbox_max;
              this->m_bbox_max = bbox_cv_min;
              this->m_bbox_status = '\x01';
              goto LAB_00646842;
            }
          }
        }
      }
      local_170 = (ON_OutlineFigurePoint *)&degree_1;
      do {
        ON_OutlineFigurePoint::ON_OutlineFigurePoint(local_170);
        local_170 = local_170 + 1;
      } while (local_170 != (ON_OutlineFigurePoint *)&cv[3].m_point);
      cv[2].m_point = *(ON_2fPoint *)pOVar4;
      cv[3]._0_4_ = (pOVar4->m_point).y;
      for (bez.m_reserved_ON_BezierCurve = 0; (uint)bez.m_reserved_ON_BezierCurve < (uint)fVar3;
          bez.m_reserved_ON_BezierCurve = bez.m_reserved_ON_BezierCurve + 1) {
        bez.m_cv_capacity = Internal_SegmentDegree(this,bez.m_reserved_ON_BezierCurve);
        if ((1 < (uint)bez.m_cv_capacity) && ((uint)bez.m_cv_capacity < 4)) {
          pOVar5 = pOVar4 + (uint)bez.m_reserved_ON_BezierCurve;
          degree_1._0_1_ = pOVar5->m_point_type;
          degree_1._1_1_ = pOVar5->m_point_proximity;
          degree_1._2_2_ = pOVar5->m_figure_index;
          unique0x00012004 = (pOVar5->m_point).x;
          cv[0]._0_4_ = (pOVar5->m_point).y;
          uVar6 = bez.m_reserved_ON_BezierCurve + 1;
          pOVar5 = pOVar4 + uVar6;
          uVar1._0_1_ = pOVar5->m_point_type;
          uVar1._1_1_ = pOVar5->m_point_proximity;
          uVar1._2_2_ = pOVar5->m_figure_index;
          uVar1._4_4_ = (pOVar5->m_point).x;
          cv[0].m_point.x = (float)uVar1;
          cv[1]._0_4_ = (pOVar5->m_point).y;
          i = cv[1]._0_4_;
          degree = uVar1._4_4_;
          cv[1].m_point = *(ON_2fPoint *)(pOVar4 + (bez.m_reserved_ON_BezierCurve + 2));
          cv[2]._0_4_ = pOVar4[bez.m_reserved_ON_BezierCurve + 2].m_point.y;
          bez.m_reserved_ON_BezierCurve = uVar6;
          cv[0].m_point.y = (float)uVar1._4_4_;
          bbox_cv_max = _degree;
          if (bez.m_cv_capacity == 3) {
            Internal_GrowBBox((ON_2fPoint *)&cv[1].m_point.y,(ON_2fPoint *)&cv[1].m_point.y,
                              &bbox_cv_max,(ON_2fPoint *)&degree);
            cv[2].m_point = *(ON_2fPoint *)(pOVar4 + (bez.m_reserved_ON_BezierCurve + 2));
            cv[3]._0_4_ = pOVar4[bez.m_reserved_ON_BezierCurve + 2].m_point.y;
            bez.m_reserved_ON_BezierCurve = bez.m_reserved_ON_BezierCurve + 1;
          }
          if (bbox_max.x <= bbox_cv_max.x) {
            if ((float)degree <= bbox_cv_min.x) {
              if (bbox_max.y <= bbox_cv_max.y) {
                if ((float)i <= bbox_cv_min.y) goto LAB_006467c4;
              }
            }
          }
          ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)local_b0,3,false,bez.m_cv_capacity + 1);
          for (local_b4 = 0; uVar6 = local_b4, local_b4 <= (uint)bez.m_cv_capacity;
              local_b4 = local_b4 + 1) {
            ON_3dPoint::ON_3dPoint
                      (&local_d0,(double)cv[(ulong)local_b4 - 1].m_point.y,
                       (double)*(float *)(cv + local_b4),0.0);
            ON_BezierCurve::SetCV((ON_BezierCurve *)local_b0,uVar6,&local_d0);
          }
          ON_BezierCurve::BoundingBox((ON_BoundingBox *)&minf,(ON_BezierCurve *)local_b0);
          bVar2 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&minf);
          if (bVar2) {
            maxf = -1.2343210235867887e+38;
            local_120 = 0x47d7370a20000000;
            if ((((-1.2343210235867887e+38 < minf) && (bez_bbox.m_min.z < 1.2343210235867887e+38))
                && (-1.2343210235867887e+38 < bez_bbox.m_min.x)) &&
               (bez_bbox.m_max.x < 1.2343210235867887e+38)) {
              ON_2fPoint::Set(&bbox_cv_max,(float)minf,(float)bez_bbox.m_min.x);
              ON_2fPoint::Set((ON_2fPoint *)&degree,(float)bez_bbox.m_min.z,(float)bez_bbox.m_max.x)
              ;
            }
          }
          Internal_GrowBBox(&bbox_cv_max,(ON_2fPoint *)&degree,&bbox_cv_max,(ON_2fPoint *)&degree);
          ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_b0);
        }
LAB_006467c4:
      }
      this->m_bbox_min = bbox_max;
      this->m_bbox_max = bbox_cv_min;
      this->m_bbox_status = '\x01';
      bVar2 = ON_2fPoint::operator==(&this->m_bbox_min,&this->m_bbox_max);
      if ((bVar2) &&
         (((this->m_figure_type == Perimeter || (this->m_figure_type == Unset)) ||
          (this->m_figure_type == Unknown)))) {
        this->m_figure_type = NotPerimeter;
      }
    }
  }
LAB_00646842:
  if (this->m_bbox_status == '\x01') {
    ON_3dPoint::ON_3dPoint(&local_138,&this->m_bbox_min);
    ON_3dPoint::ON_3dPoint(&local_150,&this->m_bbox_max);
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__,&local_138,&local_150);
  }
  else {
    memcpy(__return_storage_ptr__,&ON_BoundingBox::NanBoundingBox,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_OutlineFigure::BoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();
    ON_2fPoint bbox_min = a[0].m_point;
    ON_2fPoint bbox_max = bbox_min;
    ON_2fPoint bbox_cv_min = bbox_min;
    ON_2fPoint bbox_cv_max = bbox_max;
    
    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 1U || degree > 3U)
        continue;
      // a[i] = start of bezier (line,quadratic,or cubic)
      ON_OutlineFigurePoint p = a[i+degree]; // p = a[i+degree] = end of bezier (line,quadratic,or cubic)
      Internal_GrowBBox(p.m_point, p.m_point, bbox_min, bbox_max);
      if (degree >= 2U)
      {
        p = a[++i]; // p = 1st interior cv of a quadratic or cubic bezier
        Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        if (3U == degree)
        {
          p = a[++i]; // p = 2nd interior cv of a cubic bezier
          Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        }
      }
    }

    if (
      bbox_cv_min.x >= bbox_min.x 
      && bbox_cv_max.x <= bbox_max.x
      && bbox_cv_min.y >= bbox_min.y 
      && bbox_cv_max.y <= bbox_max.y
      )
    {
      // If there were any bezier segments, their control points were inside the bounding box of the segment end points.
      m_bbox_min = bbox_min;
      m_bbox_max = bbox_max;
      m_bbox_status = 1;
      break;
    }

    // get bezeir bounding boxes as needed
    ON_OutlineFigurePoint cv[4];
    cv[3] = a[0]; // to suppress potintial uninitialized memory warning

    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 2U || degree > 3U)
        continue; // correct to continue when degree = 1
      cv[0] = a[i]; // [a[i] = start of quadratic or cubic bezier
      cv[1] = a[++i]; // 1st interior cv of a  quadratic or cubic bezer
      bbox_cv_min = cv[1].m_point;
      bbox_cv_max = bbox_cv_min;
      cv[2] = a[i + 1]; // end of quadratic bezier or penultimate cv of a cubic bezier
      if (3U == degree)
      {
        Internal_GrowBBox(cv[2].m_point, cv[2].m_point, bbox_cv_min, bbox_cv_max);
        ++i;
        cv[3] = a[i + 1]; // end of a cubic bezier
      }

      if (
        bbox_cv_min.x >= bbox_min.x 
        && bbox_cv_max.x <= bbox_max.x
        && bbox_cv_min.y >= bbox_min.y 
        && bbox_cv_max.y <= bbox_max.y
        )
      {
        // the control points of this bezier are inside the current bounding box.
        continue;
      }

      // get tight bounding box of this bezier
      ON_BezierCurve bez(3, false, degree + 1);
      for (ON__UINT32 j = 0; j <= degree; j++)
        bez.SetCV(j, ON_3dPoint(cv[j].m_point.x, cv[j].m_point.y, 0.0));

      const ON_BoundingBox bez_bbox = bez.BoundingBox();
      if (bez_bbox.IsNotEmpty())
      {
        const double minf = ON_UNSET_FLOAT;
        const double maxf = ON_UNSET_POSITIVE_FLOAT;
        if (
          minf < bez_bbox.m_min.x 
          && bez_bbox.m_max.x < maxf
          && minf < bez_bbox.m_min.y 
          && bez_bbox.m_max.y < maxf
          )
        {
          bbox_cv_min.Set((float)bez_bbox.m_min.x, (float)bez_bbox.m_min.y);
          bbox_cv_max.Set((float)bez_bbox.m_max.x, (float)bez_bbox.m_max.y);
        }
      }

      Internal_GrowBBox(bbox_cv_min, bbox_cv_max, bbox_cv_min, bbox_cv_max);
    }

    m_bbox_min = bbox_min;
    m_bbox_max = bbox_max;
    m_bbox_status = 1;
    if (m_bbox_min == m_bbox_max)
    {
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
    }
    break;
  }

  if (1 == m_bbox_status)
    return ON_BoundingBox(ON_3dPoint(m_bbox_min), ON_3dPoint(m_bbox_max));

  return ON_BoundingBox::NanBoundingBox;
}